

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O0

void Io_WriteAiger_old(Abc_Ntk_t *pNtk,char *pFileName,int fWriteSymbols,int fCompact)

{
  FILE *pFile_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Abc_Obj_t *pAVar8;
  FILE *__stream;
  char *pcVar9;
  Abc_Obj_t *pObj_00;
  Vec_Int_t *vLits_00;
  Vec_Str_t *p;
  uchar *pBuffer_00;
  ProgressBar *p_00;
  Abc_Obj_t *pAVar10;
  size_t sVar11;
  int local_cc;
  uint Temp;
  Vec_Str_t *vBinary;
  Vec_Int_t *vLits;
  uint local_70;
  uint uLit;
  uint uLit1;
  uint uLit0;
  uchar *pBuffer;
  int local_58;
  int fExtended;
  int Pos;
  int nBufferSize;
  int nNodes;
  int i;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pObj;
  FILE *pFile;
  ProgressBar *pProgress;
  int fCompact_local;
  int fWriteSymbols_local;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  pBuffer._4_4_ = Abc_NtkConstrNum(pNtk);
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                  ,0x118,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
  }
  nBufferSize = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vBoxes);
    if (iVar1 <= nBufferSize) {
LAB_003570f5:
      __stream = fopen(pFileName,"wb");
      if (__stream == (FILE *)0x0) {
        fprintf(_stdout,"Io_WriteAiger(): Cannot open the output file \"%s\".\n",pFileName);
      }
      else {
        pAVar8 = Abc_AigConst1(pNtk);
        Io_ObjSetAigerNum(pAVar8,0);
        Pos = 1;
        for (nBufferSize = 0; iVar1 = Abc_NtkCiNum(pNtk), nBufferSize < iVar1;
            nBufferSize = nBufferSize + 1) {
          pAVar8 = Abc_NtkCi(pNtk,nBufferSize);
          Io_ObjSetAigerNum(pAVar8,Pos);
          Pos = Pos + 1;
        }
        for (nBufferSize = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), nBufferSize < iVar1;
            nBufferSize = nBufferSize + 1) {
          pAVar8 = Abc_NtkObj(pNtk,nBufferSize);
          if ((pAVar8 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar8), iVar1 != 0)) {
            Io_ObjSetAigerNum(pAVar8,Pos);
            Pos = Pos + 1;
          }
        }
        pcVar9 = "";
        if (fCompact != 0) {
          pcVar9 = "2";
        }
        iVar1 = Abc_NtkPiNum(pNtk);
        iVar2 = Abc_NtkLatchNum(pNtk);
        iVar3 = Abc_NtkNodeNum(pNtk);
        uVar4 = Abc_NtkPiNum(pNtk);
        uVar5 = Abc_NtkLatchNum(pNtk);
        if (pBuffer._4_4_ == 0) {
          local_cc = Abc_NtkPoNum(pNtk);
        }
        else {
          local_cc = 0;
        }
        iVar6 = Abc_NtkNodeNum(pNtk);
        fprintf(__stream,"aig%s %u %u %u %u %u",pcVar9,(ulong)(uint)(iVar1 + iVar2 + iVar3),
                (ulong)uVar4,(ulong)uVar5,local_cc,iVar6);
        if (pBuffer._4_4_ != 0) {
          iVar1 = Abc_NtkPoNum(pNtk);
          iVar2 = Abc_NtkConstrNum(pNtk);
          uVar4 = Abc_NtkConstrNum(pNtk);
          fprintf(__stream," %u %u",(ulong)(uint)(iVar1 - iVar2),(ulong)uVar4);
        }
        fprintf(__stream,"\n");
        Abc_NtkInvertConstraints(pNtk);
        if (fCompact == 0) {
          for (nBufferSize = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), nBufferSize < iVar1;
              nBufferSize = nBufferSize + 1) {
            pAVar8 = Abc_NtkBox(pNtk,nBufferSize);
            iVar1 = Abc_ObjIsLatch(pAVar8);
            if (iVar1 != 0) {
              pAVar10 = Abc_ObjFanin0(pAVar8);
              pObj_00 = Abc_ObjFanin0(pAVar10);
              uVar4 = Io_ObjAigerNum(pObj_00);
              uVar5 = Abc_ObjFaninC0(pAVar10);
              uVar7 = Io_ObjAigerNum(pObj_00);
              uVar4 = Io_ObjMakeLit(uVar4,uVar5 ^ uVar7 == 0);
              iVar1 = Abc_LatchIsInit0(pAVar8);
              if (iVar1 == 0) {
                iVar1 = Abc_LatchIsInit1(pAVar8);
                if (iVar1 == 0) {
                  iVar1 = Abc_LatchIsInitNone(pAVar8);
                  if ((iVar1 == 0) && (iVar1 = Abc_LatchIsInitDc(pAVar8), iVar1 == 0)) {
                    __assert_fail("Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                                  ,0x156,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
                  }
                  pAVar8 = Abc_ObjFanout0(pAVar8);
                  uVar5 = Io_ObjAigerNum(pAVar8);
                  uVar5 = Io_ObjMakeLit(uVar5,0);
                  fprintf(__stream,"%u %u\n",(ulong)uVar4,(ulong)uVar5);
                }
                else {
                  fprintf(__stream,"%u 1\n",(ulong)uVar4);
                }
              }
              else {
                fprintf(__stream,"%u\n",(ulong)uVar4);
              }
            }
          }
          for (nBufferSize = 0; iVar1 = Abc_NtkPoNum(pNtk), nBufferSize < iVar1;
              nBufferSize = nBufferSize + 1) {
            pAVar8 = Abc_NtkPo(pNtk,nBufferSize);
            pAVar10 = Abc_ObjFanin0(pAVar8);
            uVar4 = Io_ObjAigerNum(pAVar10);
            uVar5 = Abc_ObjFaninC0(pAVar8);
            uVar7 = Io_ObjAigerNum(pAVar10);
            uVar4 = Io_ObjMakeLit(uVar4,uVar5 ^ uVar7 == 0);
            fprintf(__stream,"%u\n",(ulong)uVar4);
          }
        }
        else {
          vLits_00 = Io_WriteAigerLiterals(pNtk);
          p = Io_WriteEncodeLiterals(vLits_00);
          pcVar9 = Vec_StrArray(p);
          iVar1 = Vec_StrSize(p);
          fwrite(pcVar9,1,(long)iVar1,__stream);
          Vec_StrFree(p);
          Vec_IntFree(vLits_00);
        }
        Abc_NtkInvertConstraints(pNtk);
        local_58 = 0;
        iVar1 = Abc_NtkNodeNum(pNtk);
        iVar2 = iVar1 * 6 + 100;
        pBuffer_00 = (uchar *)malloc((long)iVar2);
        pFile_00 = _stdout;
        iVar3 = Abc_NtkObjNumMax(pNtk);
        p_00 = Extra_ProgressBarStart((FILE *)pFile_00,iVar3);
        for (nBufferSize = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), nBufferSize < iVar3;
            nBufferSize = nBufferSize + 1) {
          pAVar8 = Abc_NtkObj(pNtk,nBufferSize);
          if ((pAVar8 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_AigNodeIsAnd(pAVar8), iVar3 != 0)) {
            Extra_ProgressBarUpdate(p_00,nBufferSize,(char *)0x0);
            uVar4 = Io_ObjAigerNum(pAVar8);
            uVar4 = Io_ObjMakeLit(uVar4,0);
            pAVar10 = Abc_ObjFanin0(pAVar8);
            uVar5 = Io_ObjAigerNum(pAVar10);
            iVar3 = Abc_ObjFaninC0(pAVar8);
            uLit = Io_ObjMakeLit(uVar5,iVar3);
            pAVar10 = Abc_ObjFanin1(pAVar8);
            uVar5 = Io_ObjAigerNum(pAVar10);
            iVar3 = Abc_ObjFaninC1(pAVar8);
            uVar5 = Io_ObjMakeLit(uVar5,iVar3);
            local_70 = uVar5;
            if (uVar5 < uLit) {
              local_70 = uLit;
              uLit = uVar5;
            }
            if (uVar4 <= local_70) {
              __assert_fail("uLit1 < uLit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                            ,0x17c,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
            }
            iVar3 = Io_WriteAigerEncode(pBuffer_00,local_58,uVar4 - local_70);
            local_58 = Io_WriteAigerEncode(pBuffer_00,iVar3,local_70 - uLit);
            if (iVar1 * 6 + 0x5a < local_58) {
              printf(
                    "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n"
                    );
              fclose(__stream);
              return;
            }
          }
        }
        if (iVar2 <= local_58) {
          __assert_fail("Pos < nBufferSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                        ,0x186,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
        }
        Extra_ProgressBarStop(p_00);
        fwrite(pBuffer_00,1,(long)local_58,__stream);
        if (pBuffer_00 != (uchar *)0x0) {
          free(pBuffer_00);
        }
        if (fWriteSymbols != 0) {
          for (nBufferSize = 0; iVar1 = Abc_NtkPiNum(pNtk), nBufferSize < iVar1;
              nBufferSize = nBufferSize + 1) {
            pAVar8 = Abc_NtkPi(pNtk,nBufferSize);
            pcVar9 = Abc_ObjName(pAVar8);
            fprintf(__stream,"i%d %s\n",(ulong)(uint)nBufferSize,pcVar9);
          }
          for (nBufferSize = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), nBufferSize < iVar1;
              nBufferSize = nBufferSize + 1) {
            pAVar8 = Abc_NtkBox(pNtk,nBufferSize);
            iVar1 = Abc_ObjIsLatch(pAVar8);
            if (iVar1 != 0) {
              pAVar8 = Abc_ObjFanout0(pAVar8);
              pcVar9 = Abc_ObjName(pAVar8);
              fprintf(__stream,"l%d %s\n",(ulong)(uint)nBufferSize,pcVar9);
            }
          }
          for (nBufferSize = 0; iVar1 = Abc_NtkPoNum(pNtk), nBufferSize < iVar1;
              nBufferSize = nBufferSize + 1) {
            pAVar8 = Abc_NtkPo(pNtk,nBufferSize);
            if (pBuffer._4_4_ == 0) {
              pcVar9 = Abc_ObjName(pAVar8);
              fprintf(__stream,"o%d %s\n",(ulong)(uint)nBufferSize,pcVar9);
            }
            else {
              iVar1 = Abc_NtkPoNum(pNtk);
              iVar2 = Abc_NtkConstrNum(pNtk);
              if (nBufferSize < iVar1 - iVar2) {
                pcVar9 = Abc_ObjName(pAVar8);
                fprintf(__stream,"b%d %s\n",(ulong)(uint)nBufferSize,pcVar9);
              }
              else {
                iVar1 = Abc_NtkPoNum(pNtk);
                iVar2 = Abc_NtkConstrNum(pNtk);
                pcVar9 = Abc_ObjName(pAVar8);
                fprintf(__stream,"c%d %s\n",(ulong)(uint)(nBufferSize - (iVar1 - iVar2)),pcVar9);
              }
            }
          }
        }
        fprintf(__stream,"c\n");
        if ((pNtk->pName != (char *)0x0) && (sVar11 = strlen(pNtk->pName), sVar11 != 0)) {
          fprintf(__stream,".model %s\n",pNtk->pName);
        }
        pcVar9 = Extra_TimeStamp();
        fprintf(__stream,"This file was produced by ABC on %s\n",pcVar9);
        fprintf(__stream,"For information about AIGER format, refer to %s\n",
                "http://fmv.jku.at/aiger");
        fclose(__stream);
      }
      return;
    }
    pAVar8 = Abc_NtkBox(pNtk,nBufferSize);
    iVar1 = Abc_ObjIsLatch(pAVar8);
    if ((iVar1 != 0) && (iVar1 = Abc_LatchIsInit0(pAVar8), iVar1 == 0)) {
      if (fCompact != 0) {
        fprintf(_stdout,
                "Io_WriteAiger(): Cannot write AIGER format with non-0 latch init values. Run \"zero\".\n"
               );
        return;
      }
      pBuffer._4_4_ = 1;
      goto LAB_003570f5;
    }
    nBufferSize = nBufferSize + 1;
  } while( true );
}

Assistant:

void Io_WriteAiger_old( Abc_Ntk_t * pNtk, char * pFileName, int fWriteSymbols, int fCompact )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Abc_Obj_t * pObj, * pDriver, * pLatch;
    int i, nNodes, nBufferSize, Pos, fExtended;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;

    fExtended = Abc_NtkConstrNum(pNtk);

    assert( Abc_NtkIsStrash(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( !Abc_LatchIsInit0(pObj) )
        {
            if ( !fCompact )
            {
                fExtended = 1;
                break;
            }
            fprintf( stdout, "Io_WriteAiger(): Cannot write AIGER format with non-0 latch init values. Run \"zero\".\n" );
            return;
        }

    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteAiger(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // set the node numbers to be used in the output file
    nNodes = 0;
    Io_ObjSetAigerNum( Abc_AigConst1(pNtk), nNodes++ );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );
    Abc_AigForEachAnd( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );

    // write the header "M I L O A" where M = I + L + A
    fprintf( pFile, "aig%s %u %u %u %u %u", 
        fCompact? "2" : "",
        Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) + Abc_NtkNodeNum(pNtk), 
        Abc_NtkPiNum(pNtk),
        Abc_NtkLatchNum(pNtk),
        fExtended ? 0 : Abc_NtkPoNum(pNtk),
        Abc_NtkNodeNum(pNtk) );
    // write the extended header "B C J F"
    if ( fExtended )
        fprintf( pFile, " %u %u", Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk), Abc_NtkConstrNum(pNtk) );
    fprintf( pFile, "\n" );

    // if the driver node is a constant, we need to complement the literal below
    // because, in the AIGER format, literal 0/1 is represented as number 0/1
    // while, in ABC, constant 1 node has number 0 and so literal 0/1 will be 1/0

    Abc_NtkInvertConstraints( pNtk );
    if ( !fCompact ) 
    {
        // write latch drivers
        Abc_NtkForEachLatch( pNtk, pLatch, i )
        {
            pObj = Abc_ObjFanin0(pLatch);
            pDriver = Abc_ObjFanin0(pObj);
            uLit = Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) );
            if ( Abc_LatchIsInit0(pLatch) )
                fprintf( pFile, "%u\n", uLit );
            else if ( Abc_LatchIsInit1(pLatch) )
                fprintf( pFile, "%u 1\n", uLit );
            else
            {
                // Both None and DC are written as 'uninitialized' e.g. a free boolean value
                assert( Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch) );
                fprintf( pFile, "%u %u\n", uLit, Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanout0(pLatch)), 0 ) );
            }
        }
        // write PO drivers
        Abc_NtkForEachPo( pNtk, pObj, i )
        {
            pDriver = Abc_ObjFanin0(pObj);
            fprintf( pFile, "%u\n", Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
        }
    }
    else
    {
        Vec_Int_t * vLits = Io_WriteAigerLiterals( pNtk );
        Vec_Str_t * vBinary = Io_WriteEncodeLiterals( vLits );
        fwrite( Vec_StrArray(vBinary), 1, Vec_StrSize(vBinary), pFile );
        Vec_StrFree( vBinary );
        Vec_IntFree( vLits );
    }
    Abc_NtkInvertConstraints( pNtk );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 6 * Abc_NtkNodeNum(pNtk) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        uLit  = Io_ObjMakeLit( Io_ObjAigerNum(pObj), 0 );
        uLit0 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin0(pObj)), Abc_ObjFaninC0(pObj) );
        uLit1 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin1(pObj)), Abc_ObjFaninC1(pObj) );
        if ( uLit0 > uLit1 )
        {
            unsigned Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        assert( uLit1 < uLit );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, (unsigned)(uLit  - uLit1) );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, (unsigned)(uLit1 - uLit0) );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n" );
	        fclose( pFile );
            return;
        }
    }
    assert( Pos < nBufferSize );
    Extra_ProgressBarStop( pProgress );

    // write the buffer
    fwrite( pBuffer, 1, Pos, pFile );
    ABC_FREE( pBuffer );

    // write the symbol table
    if ( fWriteSymbols )
    {
        // write PIs
        Abc_NtkForEachPi( pNtk, pObj, i )
            fprintf( pFile, "i%d %s\n", i, Abc_ObjName(pObj) );
        // write latches
        Abc_NtkForEachLatch( pNtk, pObj, i )
            fprintf( pFile, "l%d %s\n", i, Abc_ObjName(Abc_ObjFanout0(pObj)) );
        // write POs
        Abc_NtkForEachPo( pNtk, pObj, i )
            if ( !fExtended )
                fprintf( pFile, "o%d %s\n", i, Abc_ObjName(pObj) );
            else if ( i < Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk) )
                fprintf( pFile, "b%d %s\n", i, Abc_ObjName(pObj) );
            else
                fprintf( pFile, "c%d %s\n", i - (Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk)), Abc_ObjName(pObj) );
    }

    // write the comment
    fprintf( pFile, "c\n" );
    if ( pNtk->pName && strlen(pNtk->pName) > 0 )
        fprintf( pFile, ".model %s\n", pNtk->pName );
    fprintf( pFile, "This file was produced by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
	fclose( pFile );
}